

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void parse_chunk(LexState *ls)

{
  uint8_t *puVar1;
  BCPos *l1;
  ushort uVar2;
  BCLine line;
  BCLine BVar3;
  FuncState *pFVar4;
  GCtab *pGVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  LexToken LVar9;
  BCPos BVar10;
  BCPos BVar11;
  BCPos list;
  BCPos BVar12;
  BCReg BVar13;
  BCReg BVar14;
  VarInfo *pVVar15;
  GCstr *pGVar16;
  BCInsLine *pBVar17;
  VarIndex *pVVar18;
  cTValue *pcVar19;
  uint uVar20;
  BCIns ins;
  short sVar21;
  int iVar22;
  char *__s2;
  ulong uVar23;
  FuncState *pFVar24;
  uint uVar25;
  undefined4 uVar26;
  ExpDesc e;
  anon_union_8_3_2ce71dea_for_u local_98;
  MSize local_90;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined8 local_80;
  ulong local_78;
  anon_union_8_3_2ce71dea_for_u local_70;
  MSize local_68;
  undefined1 local_64;
  byte local_63;
  BCLine local_54;
  FuncScope local_50;
  ulong local_40;
  FuncState *local_38;
  
  uVar8 = ls->level + 1;
  ls->level = uVar8;
  if (199 < uVar8) {
    lj_lex_error(ls,0,LJ_ERR_XLEVELS);
  }
  do {
    iVar22 = ls->tok;
    if ((iVar22 - 0x104U < 0x1e) && ((0x20020007U >> (iVar22 - 0x104U & 0x1f) & 1) != 0)) break;
    if (0x14 < iVar22 - 0x102U) {
      if (iVar22 != 0x11d) goto switchD_0012af6b_caseD_104;
      parse_label(ls);
      goto LAB_0012b890;
    }
    line = ls->linenumber;
    switch(iVar22) {
    case 0x102:
      lj_lex_next(ls);
      parse_break(ls);
      goto LAB_0012b522;
    case 0x103:
      lj_lex_next(ls);
      parse_block(ls);
      lex_match(ls,0x106,0x103,line);
      break;
    default:
switchD_0012af6b_caseD_104:
      pFVar24 = ls->fs;
      expr_primary(ls,(ExpDesc *)&local_98.s);
      if (local_90 == 0xd) {
        *(undefined1 *)((long)&pFVar24->bcbase[(ulong)local_98.sval & 0xffffffff].ins + 3) = 1;
      }
      else {
        local_80 = 0;
        parse_assignment(ls,(LHSVarList *)&local_98.s,1);
      }
      break;
    case 0x108:
      local_38 = ls->fs;
      local_50.nactvar = (uint8_t)local_38->nactvar;
      local_50.flags = '\x01';
      local_50.vstart = local_38->ls->vtop;
      local_50.prev = local_38->bl;
      local_38->bl = &local_50;
      lj_lex_next(ls);
      pGVar16 = lex_str(ls);
      iVar22 = ls->tok;
      if ((iVar22 == 0x2c) || (iVar22 == 0x10c)) {
        pFVar24 = ls->fs;
        local_40 = (ulong)pFVar24->pc;
        local_78 = (ulong)pFVar24->freereg;
        var_new(ls,0,(GCstr *)0x4);
        var_new(ls,1,(GCstr *)0x5);
        var_new(ls,2,(GCstr *)0x6);
        var_new(ls,3,pGVar16);
        uVar8 = 4;
        if (ls->tok == 0x2c) {
          BVar14 = 4;
          do {
            lj_lex_next(ls);
            uVar8 = BVar14 + 1;
            pGVar16 = lex_str(ls);
            var_new(ls,BVar14,pGVar16);
            BVar14 = uVar8;
          } while (ls->tok == 0x2c);
        }
        lex_check(ls,0x10c);
        BVar3 = ls->linenumber;
        BVar14 = expr_list(ls,(ExpDesc *)&local_98.s);
        assign_adjust(ls,3,BVar14,(ExpDesc *)&local_98.s);
        uVar20 = pFVar24->freereg + 3;
        if (pFVar24->framesize < uVar20) {
          if (0xf9 < uVar20) {
            err_syntax(pFVar24->ls,LJ_ERR_XSLOTS);
          }
          pFVar24->framesize = (uint8_t)uVar20;
        }
        local_54 = BVar3;
        if ((uVar8 < 6) && ((uint)local_40 < pFVar24->pc)) {
          uVar20 = pFVar24->bcbase[local_40].ins;
          if ((char)uVar20 == '6') {
            pGVar5 = pFVar24->kt;
            pGVar16 = lj_str_new(ls->L,"pairs",5);
            pcVar19 = lj_tab_getstr(pGVar5,pGVar16);
            if (((pcVar19 == (cTValue *)0x0) || ((pcVar19->field_2).it != 0)) ||
               (uVar26 = (undefined4)CONCAT71((int7)((ulong)pGVar5 >> 8),1),
               (pcVar19->u32).lo != uVar20 >> 0x10)) {
              pGVar5 = pFVar24->kt;
              pGVar16 = lj_str_new(ls->L,"next",4);
              pcVar19 = lj_tab_getstr(pGVar5,pGVar16);
              if (((pcVar19 == (cTValue *)0x0) || ((pcVar19->field_2).it != 0)) ||
                 (uVar26 = (undefined4)CONCAT71((int7)((ulong)pGVar5 >> 8),1),
                 (pcVar19->u32).lo != uVar20 >> 0x10)) goto LAB_0012bad2;
            }
          }
          else {
            if ((uVar20 & 0xff) == 0x2d) {
              pVVar18 = pFVar24->uvmap + (uVar20 >> 0x10);
            }
            else {
              if (((uVar20 & 0xff) != 0x12) || (pFVar24->nactvar <= uVar20 >> 0x10))
              goto LAB_0012bad2;
              pVVar18 = pFVar24->varmap + (uVar20 >> 0x10);
            }
            uVar23 = (ulong)ls->vstack[*pVVar18].name.gcptr32;
            iVar22 = *(int *)(uVar23 + 0xc);
            if (iVar22 == 4) {
              __s2 = "next";
            }
            else {
              if (iVar22 != 5) goto LAB_0012bad2;
              __s2 = "pairs";
            }
            iVar22 = strcmp((char *)(uVar23 + 0x10),__s2);
            uVar26 = (undefined4)CONCAT71((int7)((ulong)&local_98 >> 8),iVar22 == 0);
          }
        }
        else {
LAB_0012bad2:
          uVar26 = 0;
        }
        pFVar4 = ls->fs;
        pVVar15 = ls->vstack;
        BVar12 = pFVar4->pc;
        uVar20 = pFVar4->nactvar;
        iVar22 = 3;
        do {
          uVar2 = pFVar4->varmap[uVar20];
          pVVar15[uVar2].startpc = BVar12;
          pVVar15[uVar2].slot = (uint8_t)uVar20;
          uVar20 = uVar20 + 1;
          pVVar15[uVar2].info = '\0';
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
        pFVar4->nactvar = uVar20;
        lex_check(ls,0x103);
        iVar22 = (int)local_78 * 0x100;
        local_78 = CONCAT44(local_78._4_4_,uVar26);
        BVar12 = bcemit_INS(pFVar24,(uint)(byte)((byte)uVar26 ^ 1) * 0x10 + iVar22 + 0x300 |
                                    0x7fff0048);
        local_64 = (undefined1)pFVar24->nactvar;
        local_63 = 0;
        local_68 = pFVar24->ls->vtop;
        local_70 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
        pFVar24->bl = (FuncScope *)&local_70;
        pFVar4 = ls->fs;
        uVar20 = pFVar4->nactvar;
        BVar14 = uVar8 - 3;
        if (BVar14 != 0) {
          pVVar15 = ls->vstack;
          BVar10 = pFVar4->pc;
          uVar25 = uVar20;
          BVar13 = BVar14;
          do {
            uVar2 = pFVar4->varmap[uVar25];
            uVar20 = uVar25 + 1;
            pVVar15[uVar2].startpc = BVar10;
            pVVar15[uVar2].slot = (uint8_t)uVar25;
            pVVar15[uVar2].info = '\0';
            BVar13 = BVar13 - 1;
            uVar25 = uVar20;
          } while (BVar13 != 0);
        }
        pFVar4->nactvar = uVar20;
        bcreg_reserve(pFVar24,BVar14);
        parse_block(ls);
        fscope_end(pFVar24);
        uVar20 = (pFVar24->pc - BVar12) + 0x7fff;
        if (0xffff < uVar20) {
LAB_0012bd31:
          err_syntax(pFVar24->ls,LJ_ERR_XJUMP);
        }
        uVar25 = iVar22 + 0x300;
        *(short *)((long)&pFVar24->bcbase[BVar12].ins + 2) = (short)uVar20;
        bcemit_INS(pFVar24,(uint)(byte)local_78 + uVar8 * 0x1000000 + 0xfe000045 | uVar25 | 0x30000)
        ;
        BVar10 = bcemit_INS(pFVar24,uVar25 | 0x7fff0052);
        pBVar17 = pFVar24->bcbase;
        pBVar17[BVar10 - 1].line = local_54;
        pBVar17[BVar10].line = local_54;
        sVar21 = (short)(BVar12 - BVar10);
        if ((int)sVar21 != BVar12 - BVar10) goto LAB_0012bd31;
        *(short *)((long)&pBVar17[BVar10].ins + 2) = sVar21 + -0x8000;
      }
      else {
        if (iVar22 != 0x3d) {
          err_syntax(ls,LJ_ERR_XFOR);
        }
        pFVar24 = ls->fs;
        BVar14 = pFVar24->freereg;
        var_new(ls,0,(GCstr *)0x1);
        var_new(ls,1,(GCstr *)0x2);
        var_new(ls,2,(GCstr *)0x3);
        var_new(ls,3,pGVar16);
        lex_check(ls,0x3d);
        expr_binop(ls,(ExpDesc *)&local_98.s,0);
        expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        lex_check(ls,0x2c);
        expr_binop(ls,(ExpDesc *)&local_98.s,0);
        expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        if (ls->tok == 0x2c) {
          lj_lex_next(ls);
          expr_binop(ls,(ExpDesc *)&local_98.s,0);
          expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        }
        else {
          bcemit_INS(pFVar24,pFVar24->freereg << 8 | 0x10029);
          bcreg_reserve(pFVar24,1);
        }
        pFVar4 = ls->fs;
        pVVar15 = ls->vstack;
        BVar12 = pFVar4->pc;
        uVar8 = pFVar4->nactvar;
        iVar22 = 3;
        do {
          uVar2 = pFVar4->varmap[uVar8];
          pVVar15[uVar2].startpc = BVar12;
          pVVar15[uVar2].slot = (uint8_t)uVar8;
          uVar8 = uVar8 + 1;
          pVVar15[uVar2].info = '\0';
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
        pFVar4->nactvar = uVar8;
        lex_check(ls,0x103);
        uVar20 = BVar14 << 8;
        BVar12 = bcemit_INS(pFVar24,uVar20 | 0x7fff004d);
        local_8c = (undefined1)pFVar24->nactvar;
        local_8b = 0;
        local_90 = pFVar24->ls->vtop;
        local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
        pFVar24->bl = (FuncScope *)&local_98;
        pFVar4 = ls->fs;
        pVVar15 = ls->vstack;
        uVar8 = pFVar4->nactvar;
        uVar2 = pFVar4->varmap[uVar8];
        pVVar15[uVar2].startpc = pFVar4->pc;
        pVVar15[uVar2].slot = (uint8_t)uVar8;
        pVVar15[uVar2].info = '\0';
        pFVar4->nactvar = uVar8 + 1;
        bcreg_reserve(pFVar24,1);
        parse_block(ls);
        fscope_end(pFVar24);
        BVar10 = bcemit_INS(pFVar24,uVar20 | 0x7fff004f);
        pBVar17 = pFVar24->bcbase;
        pBVar17[BVar10].line = line;
        sVar21 = (short)(BVar12 - BVar10);
        if ((int)sVar21 != BVar12 - BVar10) goto LAB_0012bd31;
        *(short *)((long)&pBVar17[BVar10].ins + 2) = sVar21 + -0x8000;
        uVar8 = (pFVar24->pc - BVar12) + 0x7fff;
        if (0xffff < uVar8) goto LAB_0012bd31;
        *(short *)((long)&pBVar17[BVar12].ins + 2) = (short)uVar8;
      }
      lex_match(ls,0x106,0x108,line);
      pFVar24 = local_38;
      goto LAB_0012bc92;
    case 0x109:
      lj_lex_next(ls);
      pFVar24 = ls->fs;
      pGVar16 = lex_str(ls);
      var_lookup_(pFVar24,pGVar16,(ExpDesc *)&local_98.s,1);
      while (iVar22 = ls->tok, iVar22 == 0x2e) {
        expr_field(ls,(ExpDesc *)&local_98.s);
      }
      if (iVar22 == 0x3a) {
        expr_field(ls,(ExpDesc *)&local_98.s);
      }
      parse_body(ls,(ExpDesc *)&local_70.s,(uint)(iVar22 == 0x3a),line);
      pFVar24 = ls->fs;
      bcemit_store(pFVar24,(ExpDesc *)&local_98.s,(ExpDesc *)&local_70.s);
      pFVar24->bcbase[pFVar24->pc - 1].line = line;
      break;
    case 0x10a:
      LVar9 = lj_lex_lookahead(ls);
      if (LVar9 != 0x11f) goto switchD_0012af6b_caseD_104;
      lj_lex_next(ls);
      pFVar24 = ls->fs;
      pGVar16 = lex_str(ls);
      pVVar15 = gola_findlabel(ls,pGVar16);
      if (pVVar15 != (VarInfo *)0x0) {
        bcemit_INS(pFVar24,(uint)pVVar15->slot << 8 | 0x7fff0055);
      }
      puVar1 = &pFVar24->bl->flags;
      *puVar1 = *puVar1 | 4;
      BVar12 = bcemit_jmp(pFVar24);
      gola_new(ls,pGVar16,'\x02',BVar12);
      break;
    case 0x10b:
      pFVar24 = ls->fs;
      local_98.s.info = 0xffffffff;
      BVar12 = parse_then(ls);
      l1 = &pFVar24->jpc;
      while (ls->tok == 0x105) {
        BVar10 = bcemit_jmp(pFVar24);
        jmp_append(pFVar24,(BCPos *)&local_98,BVar10);
        pFVar24->lasttarget = pFVar24->pc;
        jmp_append(pFVar24,l1,BVar12);
        BVar12 = parse_then(ls);
      }
      if (ls->tok == 0x104) {
        BVar10 = bcemit_jmp(pFVar24);
        jmp_append(pFVar24,(BCPos *)&local_98,BVar10);
        pFVar24->lasttarget = pFVar24->pc;
        jmp_append(pFVar24,l1,BVar12);
        lj_lex_next(ls);
        parse_block(ls);
      }
      else {
        jmp_append(pFVar24,(BCPos *)&local_98,BVar12);
      }
      pFVar24->lasttarget = pFVar24->pc;
      jmp_append(pFVar24,l1,local_98.s.info);
      lex_match(ls,0x106,0x10b,line);
      goto LAB_0012bc9a;
    case 0x10d:
      lj_lex_next(ls);
      if (ls->tok == 0x109) {
        lj_lex_next(ls);
        pFVar24 = ls->fs;
        pGVar16 = lex_str(ls);
        var_new(ls,0,pGVar16);
        BVar14 = pFVar24->freereg;
        bcreg_reserve(pFVar24,1);
        pFVar4 = ls->fs;
        pVVar15 = ls->vstack;
        uVar8 = pFVar4->nactvar;
        uVar2 = pFVar4->varmap[uVar8];
        pVVar15[uVar2].startpc = pFVar4->pc;
        pVVar15[uVar2].slot = (uint8_t)uVar8;
        pVVar15[uVar2].info = '\0';
        pFVar4->nactvar = uVar8 + 1;
        parse_body(ls,(ExpDesc *)&local_98.s,0,ls->linenumber);
        if ((local_90 == 0xc) && (pFVar24->nactvar <= local_98.s.info)) {
          pFVar24->freereg = pFVar24->freereg - 1;
        }
        expr_toreg(pFVar24,(ExpDesc *)&local_98.s,BVar14);
        ls->vstack[pFVar24->varmap[pFVar24->nactvar - 1]].startpc = pFVar24->pc;
      }
      else {
        pGVar16 = lex_str(ls);
        var_new(ls,0,pGVar16);
        iVar22 = ls->tok;
        BVar14 = 1;
        if (iVar22 == 0x2c) {
          BVar13 = 1;
          do {
            lj_lex_next(ls);
            BVar14 = BVar13 + 1;
            pGVar16 = lex_str(ls);
            var_new(ls,BVar13,pGVar16);
            iVar22 = ls->tok;
            BVar13 = BVar14;
          } while (iVar22 == 0x2c);
        }
        if (iVar22 == 0x3d) {
          lj_lex_next(ls);
          BVar13 = expr_list(ls,(ExpDesc *)&local_98.s);
        }
        else {
          local_90 = 0xe;
          BVar13 = 0;
        }
        assign_adjust(ls,BVar14,BVar13,(ExpDesc *)&local_98.s);
        pFVar24 = ls->fs;
        uVar8 = pFVar24->nactvar;
        if (BVar14 != 0) {
          pVVar15 = ls->vstack;
          BVar12 = pFVar24->pc;
          uVar20 = uVar8;
          do {
            uVar2 = pFVar24->varmap[uVar20];
            uVar8 = uVar20 + 1;
            pVVar15[uVar2].startpc = BVar12;
            pVVar15[uVar2].slot = (uint8_t)uVar20;
            pVVar15[uVar2].info = '\0';
            BVar14 = BVar14 - 1;
            uVar20 = uVar8;
          } while (BVar14 != 0);
        }
        pFVar24->nactvar = uVar8;
      }
      break;
    case 0x111:
      pFVar24 = ls->fs;
      uVar8 = pFVar24->pc;
      pFVar24->lasttarget = uVar8;
      local_8c = (undefined1)pFVar24->nactvar;
      local_8b = 1;
      local_90 = pFVar24->ls->vtop;
      local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
      local_63 = 0;
      pFVar24->bl = (FuncScope *)&local_70;
      local_70.sval = (GCstr *)&local_98;
      local_68 = local_90;
      local_64 = local_8c;
      lj_lex_next(ls);
      bcemit_INS(pFVar24,pFVar24->nactvar << 8 | 0x55);
      parse_chunk(ls);
      lex_match(ls,0x115,0x111,line);
      BVar12 = expr_cond(ls);
      if ((local_63 & 8) == 0) {
        fscope_end(pFVar24);
      }
      else {
        parse_break(ls);
        pFVar24->lasttarget = pFVar24->pc;
        jmp_append(pFVar24,&pFVar24->jpc,BVar12);
        fscope_end(pFVar24);
        BVar12 = bcemit_jmp(pFVar24);
      }
      jmp_patch(pFVar24,BVar12,uVar8);
      uVar20 = (pFVar24->pc - uVar8) + 0x7fff;
      if (0xffff < uVar20) goto LAB_0012bd31;
      *(short *)((long)&pFVar24->bcbase[uVar8].ins + 2) = (short)uVar20;
LAB_0012bc92:
      fscope_end(pFVar24);
      goto LAB_0012bc9a;
    case 0x112:
      pFVar24 = ls->fs;
      lj_lex_next(ls);
      bVar7 = pFVar24->flags | 0x20;
      pFVar24->flags = bVar7;
      ins = 0x1004b;
      uVar8 = ls->tok - 0x104;
      if (((0x1d < uVar8) || ((0x20020007U >> (uVar8 & 0x1f) & 1) == 0)) && (ls->tok != 0x3b)) {
        BVar14 = expr_list(ls,(ExpDesc *)&local_98.s);
        if (BVar14 == 1) {
          if (local_90 == 0xd) {
            pBVar17 = pFVar24->bcbase;
            if ((char)pBVar17[(ulong)local_98.sval & 0xffffffff].ins == 'G') goto LAB_0012b9fb;
            pFVar24->pc = pFVar24->pc - 1;
            uVar8 = (pBVar17[(ulong)local_98.sval & 0xffffffff].ins & 0xff) + 2;
            uVar20 = pBVar17[(ulong)local_98.sval & 0xffffffff].ins & 0xffff00;
LAB_0012bcf6:
            ins = uVar20 | uVar8;
          }
          else {
            BVar14 = expr_toanyreg(pFVar24,(ExpDesc *)&local_98.s);
            ins = BVar14 << 8 | 0x2004c;
          }
        }
        else {
          if (local_90 != 0xd) {
            expr_tonextreg(pFVar24,(ExpDesc *)&local_98.s);
            uVar8 = pFVar24->nactvar << 8;
            uVar20 = BVar14 * 0x10000 + 0x1004a;
            goto LAB_0012bcf6;
          }
          pBVar17 = pFVar24->bcbase;
LAB_0012b9fb:
          *(undefined1 *)((long)&pBVar17[(ulong)local_98.sval & 0xffffffff].ins + 3) = 0;
          ins = (local_98.s.aux - pFVar24->nactvar) * 0x10000 | pFVar24->nactvar << 8 | 0x49;
        }
        bVar7 = pFVar24->flags;
      }
      if ((bVar7 & 1) != 0) {
        bcemit_INS(pFVar24,0x80000032);
      }
      bcemit_INS(pFVar24,ins);
LAB_0012b522:
      bVar6 = false;
      goto LAB_0012bca1;
    case 0x116:
      pFVar24 = ls->fs;
      lj_lex_next(ls);
      BVar12 = pFVar24->pc;
      pFVar24->lasttarget = BVar12;
      BVar10 = expr_cond(ls);
      local_8c = (undefined1)pFVar24->nactvar;
      local_8b = 1;
      local_90 = pFVar24->ls->vtop;
      local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
      pFVar24->bl = (FuncScope *)&local_98;
      lex_check(ls,0x103);
      BVar11 = bcemit_INS(pFVar24,pFVar24->nactvar << 8 | 0x55);
      parse_block(ls);
      list = bcemit_jmp(pFVar24);
      jmp_patch(pFVar24,list,BVar12);
      lex_match(ls,0x106,0x116,line);
      fscope_end(pFVar24);
      pFVar24->lasttarget = pFVar24->pc;
      jmp_append(pFVar24,&pFVar24->jpc,BVar10);
      uVar8 = (pFVar24->pc - BVar11) + 0x7fff;
      if (0xffff < uVar8) goto LAB_0012bd31;
      *(short *)((long)&pFVar24->bcbase[BVar11].ins + 2) = (short)uVar8;
LAB_0012bc9a:
      bVar6 = true;
      goto LAB_0012bca1;
    }
LAB_0012b890:
    bVar6 = true;
LAB_0012bca1:
    if (ls->tok == 0x3b) {
      lj_lex_next(ls);
    }
    ls->fs->freereg = ls->fs->nactvar;
  } while (bVar6);
  ls->level = ls->level - 1;
  return;
}

Assistant:

static void parse_chunk(LexState *ls)
{
  int islast = 0;
  synlevel_begin(ls);
  while (!islast && !parse_isend(ls->tok)) {
    islast = parse_stmt(ls);
    lex_opt(ls, ';');
    lj_assertLS(ls->fs->framesize >= ls->fs->freereg &&
		ls->fs->freereg >= ls->fs->nactvar,
		"bad regalloc");
    ls->fs->freereg = ls->fs->nactvar;  /* Free registers after each stmt. */
  }
  synlevel_end(ls);
}